

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

void __thiscall
itlib::small_vector<double,_4UL,_0UL,_std::allocator<double>_>::small_vector
          (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *this,
          small_vector<double,_4UL,_0UL,_std::allocator<double>_> *v,allocator<double> *alloc)

{
  double *pdVar1;
  size_t sVar2;
  pointer pdVar3;
  size_type __n;
  
  this->m_dynamic_capacity = 0;
  this->m_dynamic_data = (pointer)0x0;
  __n = (long)v->m_end - (long)v->m_begin >> 3;
  if (__n < 5) {
    this->m_end = (pointer)this->m_static_data;
    this->m_begin = (pointer)this->m_static_data;
    sVar2 = 4;
  }
  else {
    this->m_dynamic_capacity = __n;
    pdVar1 = __gnu_cxx::new_allocator<double>::allocate
                       ((new_allocator<double> *)this,__n,(void *)0x0);
    this->m_dynamic_data = pdVar1;
    this->m_end = pdVar1;
    this->m_begin = pdVar1;
    sVar2 = (long)v->m_end - (long)v->m_begin >> 3;
  }
  this->m_capacity = sVar2;
  for (pdVar3 = v->m_begin; pdVar3 != v->m_end; pdVar3 = pdVar3 + 1) {
    pdVar1 = this->m_end;
    *pdVar1 = *pdVar3;
    this->m_end = pdVar1 + 1;
  }
  return;
}

Assistant:

small_vector(const small_vector& v, const Alloc& alloc)
        : m_alloc(alloc)
        , m_dynamic_capacity(0)
        , m_dynamic_data(nullptr)
    {
        if (v.size() > StaticCapacity)
        {
            m_dynamic_capacity = v.size();
            m_begin = m_end = m_dynamic_data = atraits::allocate(get_alloc(), m_dynamic_capacity);
            m_capacity = v.size();
        }
        else
        {
            m_begin = m_end = static_begin_ptr();
            m_capacity = StaticCapacity;
        }

        for (auto p = v.m_begin; p != v.m_end; ++p)
        {
            atraits::construct(get_alloc(), m_end, *p);
            ++m_end;
        }
    }